

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * nlohmann::json_abi_v3_11_3::detail::
         serializer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
         ::hex_bytes(uint8_t byte)

{
  char cVar1;
  char *pcVar2;
  byte in_SIL;
  string *in_RDI;
  char *nibble_to_hex;
  string *result;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_b;
  undefined1 local_a;
  byte local_9;
  
  local_a = 0;
  __a = &local_b;
  local_9 = in_SIL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
  std::allocator<char>::~allocator(&local_b);
  cVar1 = "0123456789ABCDEF"[local_9 >> 4];
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
  *pcVar2 = cVar1;
  cVar1 = "0123456789ABCDEF"[local_9 & 0xf];
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
  *pcVar2 = cVar1;
  return in_RDI;
}

Assistant:

static std::string hex_bytes(std::uint8_t byte)
    {
        std::string result = "FF";
        constexpr const char* nibble_to_hex = "0123456789ABCDEF";
        result[0] = nibble_to_hex[byte / 16];
        result[1] = nibble_to_hex[byte % 16];
        return result;
    }